

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagsValidator_ValidFlagViaSetValue::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined8 extraout_RAX;
  char *value;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  FlagSaver local_40;
  string local_38;
  
  FlagSaver::FlagSaver(&local_40);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator");
  bVar2 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  _GLOBAL__N_1::Test_FlagsValidator_ValidFlagViaSetValue::Run
            ((Test_FlagsValidator_ValidFlagViaSetValue *)(ulong)bVar2);
  (anonymous_namespace)::fLI::FLAGS_test_flag = 100;
  SetCommandLineOptionWithMode_abi_cxx11_(&local_38,(gflags *)0x1512be,"5",(char *)0x0,in_R8D);
  iVar3 = std::__cxx11::string::compare((char *)&local_38);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    _GLOBAL__N_1::Test_FlagsValidator_ValidFlagViaSetValue::Run();
LAB_0013aaac:
    _GLOBAL__N_1::Test_FlagsValidator_ValidFlagViaSetValue::Run();
  }
  else {
    value = (char *)0x2;
    SetCommandLineOptionWithMode_abi_cxx11_(&local_38,(gflags *)0x1512be,"5",(char *)0x2,in_R8D);
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (iVar3 == 0) goto LAB_0013aaac;
    SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x1512be,"5",value);
    iVar3 = std::__cxx11::string::compare((char *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      bVar2 = RegisterFlagValidator
                        (&(anonymous_namespace)::fLI::FLAGS_test_flag,
                         (_func_bool_char_ptr_int32 *)0x0);
      if (bVar2) {
        FlagSaver::~FlagSaver(&local_40);
        return;
      }
      goto LAB_0013aab6;
    }
  }
  _GLOBAL__N_1::Test_FlagsValidator_ValidFlagViaSetValue::Run();
LAB_0013aab6:
  _GLOBAL__N_1::Test_FlagsValidator_ValidFlagViaSetValue::Run();
  FlagSaver::~FlagSaver(&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagsValidator, ValidFlagViaSetValue) {
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  FLAGS_test_flag = 100;   // doesn't trigger the validator
  // SetCommandLineOptionWithMode returns the empty string on error.
  EXPECT_NE("", SetCommandLineOptionWithMode("test_flag", "5",
                                             SET_FLAGS_VALUE));
  EXPECT_NE("", SetCommandLineOptionWithMode("test_flag", "5",
                                             SET_FLAGS_DEFAULT));
  EXPECT_NE("", SetCommandLineOption("test_flag", "5"));
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
}